

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void freehash(hashelement_t **hash)

{
  hashelement_t *phVar1;
  hashelement_t *e2;
  hashelement_t *e1;
  int32 i;
  hashelement_t **hash_local;
  
  for (e1._4_4_ = 0; e1._4_4_ < 0x5dc1; e1._4_4_ = e1._4_4_ + 1) {
    e2 = hash[e1._4_4_];
    while (e2 != (hashelement_t *)0x0) {
      phVar1 = e2->next;
      free(e2->basephone);
      if (e2->leftcontext != (char *)0x0) {
        free(e2->leftcontext);
      }
      if (e2->rightcontext != (char *)0x0) {
        free(e2->rightcontext);
      }
      if (e2->wordposition != (char *)0x0) {
        free(e2->wordposition);
      }
      free(e2);
      e2 = phVar1;
    }
  }
  free(hash);
  return;
}

Assistant:

void freehash(hashelement_t **hash)
{
    int32 i;
    hashelement_t *e1, *e2;

    for (i=0; i < HASHSIZE; i++){
        e1 = hash[i];
        while (e1 != NULL){
	   e2 = e1->next;
	   free(e1->basephone);
	   if (e1->leftcontext != NULL) free(e1->leftcontext);
	   if (e1->rightcontext != NULL) free(e1->rightcontext);
	   if (e1->wordposition != NULL) free(e1->wordposition);
           free(e1);
           e1 = e2;
        }
    }
    free(hash);
}